

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

DataBuffer * __thiscall
sglr::ReferenceContext::getBufferBinding(ReferenceContext *this,deUint32 target)

{
  DataBuffer *pDVar1;
  VertexArray *pVVar2;
  
  pDVar1 = (DataBuffer *)0x0;
  if ((int)target < 0x8a11) {
    if ((int)target < 0x88eb) {
      if (target == 0x8892) {
        return this->m_arrayBufferBinding;
      }
      if (target == 0x8893) {
        pVVar2 = &this->m_clientVertexArray;
        if (this->m_vertexArrayBinding != (VertexArray *)0x0) {
          pVVar2 = this->m_vertexArrayBinding;
        }
        return pVVar2->m_elementArrayBufferBinding;
      }
    }
    else {
      if (target == 0x88eb) {
        return this->m_pixelPackBufferBinding;
      }
      if (target == 0x88ec) {
        return this->m_pixelUnpackBufferBinding;
      }
    }
  }
  else {
    pDVar1 = (DataBuffer *)0x0;
    if ((int)target < 0x8f36) {
      if (target == 0x8a11) {
        pDVar1 = this->m_uniformBufferBinding;
      }
      else if (target == 0x8c8e) {
        return this->m_transformFeedbackBufferBinding;
      }
    }
    else {
      if (target == 0x8f36) {
        return this->m_copyReadBufferBinding;
      }
      if (target == 0x8f37) {
        return this->m_copyWriteBufferBinding;
      }
      if (target == 0x8f3f) {
        return this->m_drawIndirectBufferBinding;
      }
    }
  }
  return pDVar1;
}

Assistant:

DataBuffer* ReferenceContext::getBufferBinding (deUint32 target) const
{
	const VertexArray* vertexArrayObject = (m_vertexArrayBinding) ? (m_vertexArrayBinding) : (&m_clientVertexArray);

	switch (target)
	{
		case GL_ARRAY_BUFFER:				return m_arrayBufferBinding;
		case GL_COPY_READ_BUFFER:			return m_copyReadBufferBinding;
		case GL_COPY_WRITE_BUFFER:			return m_copyWriteBufferBinding;
		case GL_DRAW_INDIRECT_BUFFER:		return m_drawIndirectBufferBinding;
		case GL_ELEMENT_ARRAY_BUFFER:		return vertexArrayObject->m_elementArrayBufferBinding;
		case GL_PIXEL_PACK_BUFFER:			return m_pixelPackBufferBinding;
		case GL_PIXEL_UNPACK_BUFFER:		return m_pixelUnpackBufferBinding;
		case GL_TRANSFORM_FEEDBACK_BUFFER:	return m_transformFeedbackBufferBinding;
		case GL_UNIFORM_BUFFER:				return m_uniformBufferBinding;
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}